

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QEmbedableButton_p.h
# Opt level: O1

void __thiscall QEmbedableButton::~QEmbedableButton(QEmbedableButton *this)

{
  QToolButton::~QToolButton(&this->super_QToolButton);
  operator_delete(this,0x30);
  return;
}

Assistant:

class QT_WIDGETS_EXTRA_QT_WIDGETS_EXTRA_LIB_EXPORT QEmbedableButton : public QToolButton {
    Q_OBJECT

public:
    explicit QEmbedableButton(QWidget *parent = nullptr);

    bool isEmbeded() const;
    void setEmbeded(bool embed);

protected:
    void paintEvent(QPaintEvent *event) override;

private:
    bool embeded;
}